

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_fir_filter.cc
# Opt level: O0

void __thiscall
webrtc::SparseFIRFilter::SparseFIRFilter
          (SparseFIRFilter *this,float *nonzero_coeffs,size_t num_nonzero_coeffs,size_t sparsity,
          size_t offset)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  FatalMessage local_360;
  uint local_1e4;
  string *local_1e0;
  string *_result_1;
  uint local_5c;
  string *local_58;
  string *_result;
  value_type local_48 [5];
  allocator<float> local_31;
  size_t local_30;
  size_t offset_local;
  size_t sparsity_local;
  size_t num_nonzero_coeffs_local;
  float *nonzero_coeffs_local;
  SparseFIRFilter *this_local;
  
  this->sparsity_ = sparsity;
  this->offset_ = offset;
  local_30 = offset;
  offset_local = sparsity;
  sparsity_local = num_nonzero_coeffs;
  num_nonzero_coeffs_local = (size_t)nonzero_coeffs;
  nonzero_coeffs_local = (float *)this;
  std::allocator<float>::allocator(&local_31);
  std::vector<float,std::allocator<float>>::vector<float_const*,void>
            ((vector<float,std::allocator<float>> *)&this->nonzero_coeffs_,nonzero_coeffs,
             nonzero_coeffs + num_nonzero_coeffs,&local_31);
  std::allocator<float>::~allocator(&local_31);
  lVar3 = sparsity_local - 1;
  sVar1 = this->sparsity_;
  sVar2 = this->offset_;
  local_48[0] = 0.0;
  std::allocator<float>::allocator((allocator<float> *)((long)&_result + 7));
  std::vector<float,_std::allocator<float>_>::vector
            (&this->state_,sVar1 * lVar3 + sVar2,local_48,(allocator<float> *)((long)&_result + 7));
  std::allocator<float>::~allocator((allocator<float> *)((long)&_result + 7));
  local_5c = 1;
  local_58 = rtc::CheckGEImpl<unsigned_long,unsigned_int>
                       (&sparsity_local,&local_5c,"num_nonzero_coeffs >= 1u");
  if (local_58 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_1,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/sparse_fir_filter.cc"
               ,0x19,local_58);
    rtc::FatalMessage::stream((FatalMessage *)&_result_1);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_1);
  }
  local_1e4 = 1;
  local_1e0 = rtc::CheckGEImpl<unsigned_long,unsigned_int>
                        (&offset_local,&local_1e4,"sparsity >= 1u");
  if (local_1e0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/sparse_fir_filter.cc"
               ,0x1a,local_1e0);
    rtc::FatalMessage::stream(&local_360);
    rtc::FatalMessage::~FatalMessage(&local_360);
  }
  return;
}

Assistant:

SparseFIRFilter::SparseFIRFilter(const float* nonzero_coeffs,
                                 size_t num_nonzero_coeffs,
                                 size_t sparsity,
                                 size_t offset)
    : sparsity_(sparsity),
      offset_(offset),
      nonzero_coeffs_(nonzero_coeffs, nonzero_coeffs + num_nonzero_coeffs),
      state_(sparsity_ * (num_nonzero_coeffs - 1) + offset_, 0.f) {
  RTC_CHECK_GE(num_nonzero_coeffs, 1u);
  RTC_CHECK_GE(sparsity, 1u);
}